

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

Sexp * ReadSublist(istream *input)

{
  Sexp *car_00;
  bool bVar1;
  int iVar2;
  Sexp *cdr_00;
  Sexp *local_40;
  Sexp *cdr;
  Sexp *local_28;
  Sexp *car;
  FrameProtector __frame_prot;
  istream *input_local;
  
  __frame_prot.protected_frame = (Frame *)input;
  FrameProtector::FrameProtector((FrameProtector *)&car,"ReadSublist");
  local_28 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&car,&local_28,"car");
  local_40 = (Sexp *)0x0;
  FrameProtector::ProtectValue((FrameProtector *)&car,&local_40,"cdr");
  bVar1 = IsAtListEnd((istream *)__frame_prot.protected_frame);
  if (bVar1) {
    input_local = (istream *)GcHeap::AllocateEmpty();
  }
  else {
    SkipWhitespace((istream *)__frame_prot.protected_frame);
    local_28 = ReadAtom((istream *)__frame_prot.protected_frame);
    SkipWhitespace((istream *)__frame_prot.protected_frame);
    bVar1 = IsAtListEnd((istream *)__frame_prot.protected_frame);
    car_00 = local_28;
    if (bVar1) {
      cdr_00 = GcHeap::AllocateEmpty();
      input_local = (istream *)GcHeap::AllocateCons(car_00,cdr_00);
    }
    else {
      iVar2 = Peek((istream *)__frame_prot.protected_frame);
      if (iVar2 == 0x2e) {
        Expect((istream *)__frame_prot.protected_frame,'.');
        local_40 = ReadAtom((istream *)__frame_prot.protected_frame);
        input_local = (istream *)GcHeap::AllocateCons(local_28,local_40);
      }
      else {
        local_40 = ReadSublist((istream *)__frame_prot.protected_frame);
        input_local = (istream *)GcHeap::AllocateCons(local_28,local_40);
      }
    }
  }
  FrameProtector::~FrameProtector((FrameProtector *)&car);
  return (Sexp *)input_local;
}

Assistant:

static Sexp *ReadSublist(std::istream &input) {
  // at this point, we are reading a list and we've already read
  // the opening paren.
  //   (call 1 2 3)
  //    ^--- we are here
  GC_HELPER_FRAME;
  GC_PROTECTED_LOCAL(car);
  GC_PROTECTED_LOCAL(cdr);

  if (IsAtListEnd(input)) {
    return GcHeap::AllocateEmpty();
  }

  SkipWhitespace(input);
  car = ReadAtom(input);
  SkipWhitespace(input);
  if (!IsAtListEnd(input)) {
    if (Peek(input) == '.') {
      // this is an improper list.
      Expect(input, '.');
      cdr = ReadAtom(input);
      return GcHeap::AllocateCons(car, cdr);
    }

    cdr = ReadSublist(input);
    return GcHeap::AllocateCons(car, cdr);
  }

  return GcHeap::AllocateCons(car, GcHeap::AllocateEmpty());
}